

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  AABBNodeMB4D *node1;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  RTCIntersectFunctionN p_Var9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  float fVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int mask;
  NodeRef stack [564];
  ulong *local_1360;
  int local_1354;
  RayQueryContext *local_1350;
  ulong local_1348;
  Ray *local_1340;
  Scene *local_1338;
  long local_1330;
  long local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1360 = local_11d0;
      aVar2 = (ray->dir).field_0.field_1;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl((undefined1  [16])aVar2,auVar17);
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar13 = vcmpps_avx512vl(auVar17,auVar24,1);
      bVar16 = (bool)((byte)uVar13 & 1);
      auVar18._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * (int)aVar2.x;
      bVar16 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar18._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * (int)aVar2.y;
      bVar16 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar18._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * (int)aVar2.z;
      bVar16 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar18._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * aVar2.field_3.a;
      auVar17 = vrcp14ps_avx512vl(auVar18);
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar19 = vfnmadd213ps_avx512vl(auVar18,auVar17,auVar19);
      auVar18 = vfmadd132ps_fma(auVar19,auVar17,auVar17);
      fVar21 = auVar18._0_4_;
      local_11f8._4_4_ = fVar21;
      local_11f8._0_4_ = fVar21;
      local_11f8._8_4_ = fVar21;
      local_11f8._12_4_ = fVar21;
      local_11f8._16_4_ = fVar21;
      local_11f8._20_4_ = fVar21;
      local_11f8._24_4_ = fVar21;
      local_11f8._28_4_ = fVar21;
      auVar33 = ZEXT3264(local_11f8);
      auVar17 = vmovshdup_avx(auVar18);
      uVar23 = auVar17._0_8_;
      local_1218._8_8_ = uVar23;
      local_1218._0_8_ = uVar23;
      local_1218._16_8_ = uVar23;
      local_1218._24_8_ = uVar23;
      auVar34 = ZEXT3264(local_1218);
      auVar19 = vshufpd_avx(auVar18,auVar18,1);
      auVar25._8_4_ = 2;
      auVar25._0_8_ = 0x200000002;
      auVar25._12_4_ = 2;
      auVar25._16_4_ = 2;
      auVar25._20_4_ = 2;
      auVar25._24_4_ = 2;
      auVar25._28_4_ = 2;
      fVar27 = fVar21 * (ray->org).field_0.m128[0];
      local_1238 = vpermps_avx2(auVar25,ZEXT1632(auVar18));
      auVar35 = ZEXT3264(local_1238);
      auVar30._8_4_ = 1;
      auVar30._0_8_ = 0x100000001;
      auVar30._12_4_ = 1;
      auVar30._16_4_ = 1;
      auVar30._20_4_ = 1;
      auVar30._24_4_ = 1;
      auVar30._28_4_ = 1;
      auVar28 = ZEXT1632(CONCAT412(auVar18._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar18._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar18._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar27))));
      auVar30 = vpermps_avx2(auVar30,auVar28);
      auVar25 = vpermps_avx2(auVar25,auVar28);
      uVar13 = (ulong)(fVar21 < 0.0) << 5;
      uVar15 = (ulong)(auVar17._0_4_ < 0.0) << 5 | 0x40;
      uVar12 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x80;
      uVar14 = uVar13 ^ 0x20;
      uVar22 = auVar3._0_4_;
      local_1258._4_4_ = uVar22;
      local_1258._0_4_ = uVar22;
      local_1258._8_4_ = uVar22;
      local_1258._12_4_ = uVar22;
      local_1258._16_4_ = uVar22;
      local_1258._20_4_ = uVar22;
      local_1258._24_4_ = uVar22;
      local_1258._28_4_ = uVar22;
      auVar29 = ZEXT3264(local_1258);
      local_1278._4_4_ = fVar1;
      local_1278._0_4_ = fVar1;
      local_1278._8_4_ = fVar1;
      local_1278._12_4_ = fVar1;
      local_1278._16_4_ = fVar1;
      local_1278._20_4_ = fVar1;
      local_1278._24_4_ = fVar1;
      local_1278._28_4_ = fVar1;
      auVar32 = ZEXT3264(local_1278);
      local_1298._0_8_ = CONCAT44(fVar27,fVar27) ^ 0x8000000080000000;
      local_1298._8_4_ = -fVar27;
      local_1298._12_4_ = -fVar27;
      local_1298._16_4_ = -fVar27;
      local_1298._20_4_ = -fVar27;
      local_1298._24_4_ = -fVar27;
      local_1298._28_4_ = -fVar27;
      auVar36 = ZEXT3264(local_1298);
      local_12b8._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = auVar30._8_4_ ^ 0x80000000;
      local_12b8._12_4_ = auVar30._12_4_ ^ 0x80000000;
      local_12b8._16_4_ = auVar30._16_4_ ^ 0x80000000;
      local_12b8._20_4_ = auVar30._20_4_ ^ 0x80000000;
      local_12b8._24_4_ = auVar30._24_4_ ^ 0x80000000;
      local_12b8._28_4_ = auVar30._28_4_ ^ 0x80000000;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = auVar25._8_4_ ^ 0x80000000;
      local_12d8._12_4_ = auVar25._12_4_ ^ 0x80000000;
      local_12d8._16_4_ = auVar25._16_4_ ^ 0x80000000;
      local_12d8._20_4_ = auVar25._20_4_ ^ 0x80000000;
      local_12d8._24_4_ = auVar25._24_4_ ^ 0x80000000;
      local_12d8._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar26 = ZEXT3264(local_12d8);
      local_1350 = context;
      local_1348 = uVar13;
      local_1340 = ray;
      do {
        uVar10 = local_1360[-1];
        local_1360 = local_1360 + -1;
        while ((uVar10 & 8) == 0) {
          uVar6 = uVar10 & 0xfffffffffffffff0;
          uVar22 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar20._4_4_ = uVar22;
          auVar20._0_4_ = uVar22;
          auVar20._8_4_ = uVar22;
          auVar20._12_4_ = uVar22;
          auVar20._16_4_ = uVar22;
          auVar20._20_4_ = uVar22;
          auVar20._24_4_ = uVar22;
          auVar20._28_4_ = uVar22;
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar13),auVar20,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + uVar13));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar33._0_32_,auVar36._0_32_);
          auVar30 = vmaxps_avx(auVar29._0_32_,ZEXT1632(auVar3));
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar15),auVar20,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + uVar15));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar12),auVar20,
                                    *(undefined1 (*) [32])(uVar6 + 0x40 + uVar12));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar34._0_32_,auVar31._0_32_);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar35._0_32_,auVar26._0_32_);
          auVar25 = vmaxps_avx(ZEXT1632(auVar3),ZEXT1632(auVar17));
          auVar30 = vmaxps_avx(auVar30,auVar25);
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + uVar14),auVar20,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + uVar14));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar33._0_32_,auVar36._0_32_);
          auVar25 = vminps_avx(auVar32._0_32_,ZEXT1632(auVar3));
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + (uVar15 ^ 0x20)),auVar20,
                                   *(undefined1 (*) [32])(uVar6 + 0x40 + (uVar15 ^ 0x20)));
          auVar17 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar6 + 0x100 + (uVar12 ^ 0x20)),auVar20,
                                    *(undefined1 (*) [32])(uVar6 + 0x40 + (uVar12 ^ 0x20)));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar34._0_32_,auVar31._0_32_);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar35._0_32_,auVar26._0_32_);
          auVar28 = vminps_avx(ZEXT1632(auVar3),ZEXT1632(auVar17));
          auVar25 = vminps_avx(auVar25,auVar28);
          if (((uint)uVar10 & 7) == 6) {
            uVar23 = vcmpps_avx512vl(auVar30,auVar25,2);
            uVar4 = vcmpps_avx512vl(auVar20,*(undefined1 (*) [32])(uVar6 + 0x1c0),0xd);
            uVar5 = vcmpps_avx512vl(auVar20,*(undefined1 (*) [32])(uVar6 + 0x1e0),1);
            uVar7 = (uint)uVar23 & (uint)uVar4 & (uint)uVar5;
          }
          else {
            uVar23 = vcmpps_avx512vl(auVar30,auVar25,2);
            uVar7 = (uint)uVar23;
          }
          if ((byte)uVar7 == 0) goto LAB_0069bafe;
          lVar11 = 0;
          for (uVar10 = (ulong)(byte)uVar7; (uVar10 & 1) == 0;
              uVar10 = uVar10 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar10 = *(ulong *)(uVar6 + lVar11 * 8);
          uVar7 = (uVar7 & 0xff) - 1 & uVar7 & 0xff;
          uVar8 = (ulong)uVar7;
          if (uVar7 != 0) {
            *local_1360 = uVar10;
            lVar11 = 0;
            for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar7 = uVar7 - 1 & uVar7;
            uVar8 = (ulong)uVar7;
            bVar16 = uVar7 == 0;
            while( true ) {
              local_1360 = local_1360 + 1;
              uVar10 = *(ulong *)(uVar6 + lVar11 * 8);
              if (bVar16) break;
              *local_1360 = uVar10;
              lVar11 = 0;
              for (uVar10 = uVar8; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              uVar8 = uVar8 - 1 & uVar8;
              bVar16 = uVar8 == 0;
            }
          }
        }
        local_1330 = (ulong)((uint)uVar10 & 0xf) - 8;
        if (local_1330 != 0) {
          local_1338 = local_1350->scene;
          local_1328 = 0;
          do {
            local_1320.geomID = *(uint *)((uVar10 & 0xfffffffffffffff0) + local_1328 * 8);
            local_12f0 = (local_1338->geometries).items[local_1320.geomID].ptr;
            if ((ray->mask & local_12f0->mask) != 0) {
              local_1320.primID = *(uint *)((uVar10 & 0xfffffffffffffff0) + 4 + local_1328 * 8);
              local_1354 = -1;
              local_1320.valid = &local_1354;
              local_1320.geometryUserPtr = local_12f0->userPtr;
              local_1320.context = local_1350->user;
              local_1320.N = 1;
              local_12e8 = 0;
              local_12e0 = local_1350->args;
              p_Var9 = local_12e0->intersect;
              if (p_Var9 == (RTCIntersectFunctionN)0x0) {
                p_Var9 = (RTCIntersectFunctionN)
                         local_12f0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i;
              }
              local_1320.rayhit = (RTCRayHitN *)ray;
              (*p_Var9)(&local_1320);
              auVar33 = ZEXT3264(local_11f8);
              auVar34 = ZEXT3264(local_1218);
              auVar35 = ZEXT3264(local_1238);
              auVar29 = ZEXT3264(local_1258);
              auVar32 = ZEXT3264(local_1278);
              auVar36 = ZEXT3264(local_1298);
              auVar31 = ZEXT3264(local_12b8);
              auVar26 = ZEXT3264(local_12d8);
              ray = local_1340;
              uVar13 = local_1348;
              if (local_1340->tfar < 0.0) {
                local_1340->tfar = -INFINITY;
                return;
              }
            }
            local_1328 = local_1328 + 1;
          } while (local_1330 != local_1328);
        }
LAB_0069bafe:
      } while (local_1360 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }